

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutMergeOrdered(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar14 = *(uint *)&pC0->field_0x1c;
  uVar7 = uVar14 >> 0x18;
  uVar13 = *(uint *)&pC1->field_0x1c;
  uVar6 = uVar13 >> 0x18;
  uVar9 = uVar14 >> 0x10 & 0xff;
  if ((uVar7 == uVar9) && (uVar6 == uVar9)) {
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      if ((&pC0[1].Area)[uVar3] != (&pC1[1].Area)[uVar3]) {
        return 0;
      }
      (&pC[1].Area)[uVar3] = (&pC0[1].Area)[uVar3];
    }
    uVar13 = uVar13 & 0xff000000;
    goto LAB_006f09d8;
  }
  iVar10 = 0;
  iVar11 = 0;
  if (uVar14 < 0x1000000) {
LAB_006f098a:
    if ((int)(uVar9 + iVar10) < (int)(iVar11 + uVar6)) {
      return 0;
    }
    pfVar8 = &pC[1].Area + iVar11;
    uVar13 = iVar11 << 0x18;
    for (lVar4 = (long)iVar10; lVar4 < (long)(ulong)uVar6; lVar4 = lVar4 + 1) {
      *pfVar8 = (&pC1[1].Area)[lVar4];
      uVar13 = uVar13 + 0x1000000;
      pfVar8 = pfVar8 + 1;
    }
    goto LAB_006f09d8;
  }
  uVar14 = 0;
  iVar10 = 0;
  if (0xffffff < uVar13) {
    uVar13 = 0;
    uVar3 = 0;
    uVar12 = 0;
    do {
      iVar10 = (int)uVar3;
      iVar11 = (int)uVar12;
      lVar4 = 0;
      while( true ) {
        iVar5 = (int)lVar4;
        if ((iVar11 - uVar9) + iVar5 == 0) {
          return 0;
        }
        fVar1 = (&pC0[1].Area)[(int)uVar13];
        fVar2 = (&pC1[1].Area)[iVar10 + lVar4];
        if ((int)fVar1 < (int)fVar2) {
          (&pC[1].Area)[uVar12 + lVar4] = fVar1;
          if (uVar13 + 1 == uVar7) {
            iVar10 = iVar10 + iVar5;
            goto LAB_006f0b9e;
          }
          uVar3 = (uVar3 & 0xffffffff) + lVar4;
          goto LAB_006f0b08;
        }
        if ((int)fVar1 <= (int)fVar2) break;
        (&pC[1].Area)[uVar12 + lVar4] = fVar2;
        lVar4 = lVar4 + 1;
        uVar14 = uVar13;
        if ((iVar10 - uVar6) + (int)lVar4 == 0) goto LAB_006f0b41;
      }
      (&pC[1].Area)[uVar12 + lVar4] = fVar1;
      if (uVar13 + 1 == uVar7) {
        iVar10 = iVar10 + iVar5 + 1;
LAB_006f0b9e:
        iVar11 = iVar11 + iVar5 + 1;
        goto LAB_006f098a;
      }
      uVar14 = uVar13 + 1;
      if ((iVar10 - uVar6) + iVar5 == -1) goto LAB_006f0b41;
      uVar3 = (uVar3 & 0xffffffff) + lVar4 + 1;
LAB_006f0b08:
      uVar13 = uVar13 + 1;
      uVar12 = (ulong)(iVar11 + iVar5 + 1);
    } while( true );
  }
LAB_006f0b43:
  if ((int)(uVar9 + uVar14) < (int)(iVar10 + uVar7)) {
    return 0;
  }
  pfVar8 = &pC[1].Area + iVar10;
  uVar13 = iVar10 << 0x18;
  for (lVar4 = (long)(int)uVar14; lVar4 < (long)(ulong)uVar7; lVar4 = lVar4 + 1) {
    *pfVar8 = (&pC0[1].Area)[lVar4];
    uVar13 = uVar13 + 0x1000000;
    pfVar8 = pfVar8 + 1;
  }
LAB_006f09d8:
  *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | uVar13;
  pC->uSign = pC1->uSign | pC0->uSign;
  return 1;
LAB_006f0b41:
  iVar10 = iVar11 + iVar5 + 1;
  goto LAB_006f0b43;
}

Assistant:

int If_CutMergeOrdered( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0; 
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;
}